

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

bool_t decIsValid(char *dec)

{
  bool_t bVar1;
  bool_t bVar2;
  char cVar3;
  char *pcVar4;
  
  bVar1 = strIsValid(dec);
  bVar2 = 0;
  if (bVar1 != 0) {
    cVar3 = *dec;
    if (cVar3 != '\0') {
      pcVar4 = dec + 1;
      do {
        if ((byte)(cVar3 - 0x3aU) < 0xf6) {
          return 0;
        }
        cVar3 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar3 != '\0');
    }
    bVar2 = 1;
  }
  return bVar2;
}

Assistant:

bool_t decIsValid(const char* dec)
{
	if (!strIsValid(dec))
		return FALSE;
	for (; *dec; ++dec)
		if (*dec < '0' || *dec > '9')
			return FALSE;
	return TRUE;
}